

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<11,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 in_register_00000014;
  Matrix<float,_3,_3> *extraout_RDX;
  Matrix<float,_3,_3> *extraout_RDX_00;
  Matrix<float,_3,_3> *mat;
  Matrix<float,_3,_3> *mat_00;
  Type in0;
  Vector<float,_3> VStack_c8;
  MatrixCaseUtils local_bc [12];
  tcu local_b0 [12];
  Mat3 local_a4;
  VecAccess<float,_4,_3> local_80;
  Matrix<float,_3,_3> local_68;
  Matrix<float,_3,_3> local_44;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              (&local_a4,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix(&local_a4,(float *)sr::(anonymous_namespace)::s_constInMat3x3);
    mat = extraout_RDX_00;
  }
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,3,3>
            (&local_44,(MatrixCaseUtils *)&local_a4,mat);
  reduceToVec3(local_bc,&local_44);
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,3,3>
            (&local_68,(MatrixCaseUtils *)&local_a4,mat_00);
  reduceToVec3((MatrixCaseUtils *)&VStack_c8,&local_68);
  tcu::operator+(local_b0,(Vector<float,_3> *)local_bc,&VStack_c8);
  local_80.m_vector = &evalCtx->color;
  local_80.m_index[0] = 0;
  local_80.m_index[1] = 1;
  local_80.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,(Vector<float,_3> *)local_b0);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}